

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O0

void __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
          (DynamicIntegerPointsKdTreeDecoder<2> *this,uint32_t dimension)

{
  value_type *__value;
  allocator_type *__a;
  uint in_ESI;
  undefined4 *in_RDI;
  RAnsBitDecoder *in_stack_fffffffffffffef0;
  allocator_type *in_stack_fffffffffffffef8;
  DirectBitDecoder *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  undefined1 *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff10;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  undefined1 local_6d;
  undefined4 local_6c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_4e;
  undefined4 local_28;
  undefined4 local_20;
  uint local_c;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = in_ESI;
  local_c = in_ESI;
  RAnsBitDecoder::RAnsBitDecoder(in_stack_fffffffffffffef0);
  DirectBitDecoder::DirectBitDecoder(in_stack_ffffffffffffff00);
  DirectBitDecoder::DirectBitDecoder(in_stack_ffffffffffffff00);
  DirectBitDecoder::DirectBitDecoder(in_stack_ffffffffffffff00);
  local_20 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2045a2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (value_type_conflict5 *)in_stack_ffffffffffffff00,
             (allocator_type *)in_stack_fffffffffffffef8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2045cd);
  local_28 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x204609);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (value_type_conflict5 *)in_stack_ffffffffffffff00,
             (allocator_type *)in_stack_fffffffffffffef8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x204634);
  local_4e.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_4_ = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x20467a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (value_type_conflict5 *)in_stack_ffffffffffffff00,
             (allocator_type *)in_stack_fffffffffffffef8);
  this_00 = &local_4e;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x2046ad);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(this_00,in_stack_ffffffffffffff08,&in_stack_ffffffffffffff00->bits_,
           in_stack_fffffffffffffef8);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x2046d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            (&in_stack_ffffffffffffff00->bits_);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2046f2);
  __value = (value_type *)(ulong)local_c;
  __a = (allocator_type *)(ulong)(local_c * 0x20 + 1);
  local_6c = 0;
  __n = &local_6d;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x204738);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(size_type)__n,
             (value_type_conflict5 *)__value,__a);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x20476a);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(this_00,(size_type)__n,__value,(allocator_type *)__a);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x204794);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(__value);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2047ae);
  return;
}

Assistant:

explicit DynamicIntegerPointsKdTreeDecoder(uint32_t dimension)
      : bit_length_(0),
        num_points_(0),
        num_decoded_points_(0),
        dimension_(dimension),
        p_(dimension, 0),
        axes_(dimension, 0),
        // Init the stack with the maximum depth of the tree.
        // +1 for a second leaf.
        base_stack_(32 * dimension + 1, VectorUint32(dimension, 0)),
        levels_stack_(32 * dimension + 1, VectorUint32(dimension, 0)) {}